

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O1

void Gudhi::persistence_matrix::swap
               (RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_true>_>_>
                *matrix1,
               RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_true>_>_>
               *matrix2)

{
  Index IVar1;
  Pos_index PVar2;
  Column_settings *pCVar3;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_true>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_true>_>_>_>_>_>_>_>
  *pmVar4;
  Field_operators *pFVar5;
  
  swap(&matrix1->super_RU_pairing_option,&matrix2->super_RU_pairing_option);
  swap(&matrix1->super_RU_representative_cycles_option,
       &matrix2->super_RU_representative_cycles_option);
  swap(&matrix1->reducedMatrixR_,&matrix2->reducedMatrixR_);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::swap(&(matrix1->mirrorMatrixU_).matrix_._M_h,&(matrix2->mirrorMatrixU_).matrix_._M_h);
  IVar1 = (matrix1->mirrorMatrixU_).nextInsertIndex_;
  (matrix1->mirrorMatrixU_).nextInsertIndex_ = (matrix2->mirrorMatrixU_).nextInsertIndex_;
  (matrix2->mirrorMatrixU_).nextInsertIndex_ = IVar1;
  pCVar3 = (matrix1->mirrorMatrixU_).colSettings_;
  (matrix1->mirrorMatrixU_).colSettings_ = (matrix2->mirrorMatrixU_).colSettings_;
  (matrix2->mirrorMatrixU_).colSettings_ = pCVar3;
  pmVar4 = (matrix1->mirrorMatrixU_).super_Matrix_row_access_option.rows_;
  (matrix1->mirrorMatrixU_).super_Matrix_row_access_option.rows_ =
       (matrix2->mirrorMatrixU_).super_Matrix_row_access_option.rows_;
  (matrix2->mirrorMatrixU_).super_Matrix_row_access_option.rows_ = pmVar4;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::swap(&(matrix1->pivotToColumnIndex_)._M_h,&(matrix2->pivotToColumnIndex_)._M_h);
  PVar2 = matrix1->nextEventIndex_;
  matrix1->nextEventIndex_ = matrix2->nextEventIndex_;
  matrix2->nextEventIndex_ = PVar2;
  pFVar5 = matrix1->operators_;
  matrix1->operators_ = matrix2->operators_;
  matrix2->operators_ = pFVar5;
  return;
}

Assistant:

void swap(RU_matrix& matrix1, RU_matrix& matrix2) {
    swap(static_cast<typename Master_matrix::RU_pairing_option&>(matrix1),
         static_cast<typename Master_matrix::RU_pairing_option&>(matrix2));
    swap(static_cast<typename Master_matrix::RU_vine_swap_option&>(matrix1),
         static_cast<typename Master_matrix::RU_vine_swap_option&>(matrix2));
    swap(static_cast<typename Master_matrix::RU_representative_cycles_option&>(matrix1),
         static_cast<typename Master_matrix::RU_representative_cycles_option&>(matrix2));
    swap(matrix1.reducedMatrixR_, matrix2.reducedMatrixR_);
    swap(matrix1.mirrorMatrixU_, matrix2.mirrorMatrixU_);
    matrix1.pivotToColumnIndex_.swap(matrix2.pivotToColumnIndex_);
    std::swap(matrix1.nextEventIndex_, matrix2.nextEventIndex_);
    std::swap(matrix1.operators_, matrix2.operators_);
  }